

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmt_tests.cpp
# Opt level: O2

void __thiscall pmt_tests::pmt_test1::test_method(pmt_test1 *this)

{
  uchar *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  pointer puVar8;
  pointer puVar9;
  bool bVar10;
  uint64_t uVar11;
  ulong *puVar12;
  long lVar13;
  long lVar14;
  iterator in_R8;
  iterator pvVar15;
  iterator in_R9;
  iterator pvVar16;
  uint j;
  uint uVar17;
  uint uVar18;
  int iVar19;
  size_type __n;
  ulong __n_00;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  reference rVar20;
  check_type cVar21;
  int local_438;
  char *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  undefined1 local_400 [16];
  undefined1 *local_3f0;
  char **local_3e8;
  assertion_result local_3e0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid3;
  char *local_388;
  char *local_380;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vIndex;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid2;
  char *local_2b8;
  char *local_2b0;
  undefined1 *local_2a8;
  undefined1 *local_2a0;
  char *local_298;
  char *local_290;
  _Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> local_288;
  long lStack_270;
  vector<uint256,_std::allocator<uint256>_> vMatchTxid1;
  vector<uint256,_std::allocator<uint256>_> vTxid;
  CPartialMerkleTreeTester pmt3;
  CPartialMerkleTree pmt1;
  vector<bool,_std::allocator<bool>_> vMatch;
  uint256 merkleRoot3;
  uint256 merkleRoot2;
  CMutableTransaction tx;
  uint256 merkleRoot1;
  CBlock block;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  for (lVar13 = 0; lVar13 != 0xc; lVar13 = lVar13 + 1) {
    uVar2 = test_method::tx_counts[lVar13];
    __n_00 = (ulong)uVar2;
    CBlock::CBlock(&block);
    for (uVar17 = 0; uVar2 != uVar17; uVar17 = uVar17 + 1) {
      CMutableTransaction::CMutableTransaction(&tx);
      tx.nLockTime = uVar17;
      std::make_shared<CTransaction_const,CMutableTransaction>((CMutableTransaction *)&pmt3);
      std::
      vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
      ::emplace_back<std::shared_ptr<CTransaction_const>>
                ((vector<std::shared_ptr<CTransaction_const>,std::allocator<std::shared_ptr<CTransaction_const>>>
                  *)&block.vtx,(shared_ptr<const_CTransaction> *)&pmt3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pmt3.super_CPartialMerkleTree.vBits)
      ;
      CMutableTransaction::~CMutableTransaction(&tx);
    }
    BlockMerkleRoot(&merkleRoot1,&block,(bool *)0x0);
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    std::vector<uint256,_std::allocator<uint256>_>::vector
              (&vTxid,__n_00,(value_type *)&tx,(allocator_type *)&pmt3);
    for (lVar14 = 0; __n_00 << 4 != lVar14; lVar14 = lVar14 + 0x10) {
      lVar4 = *(long *)((long)&((block.vtx.
                                 super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                               _M_ptr + lVar14);
      uVar5 = *(undefined8 *)(lVar4 + 0x39);
      uVar6 = *(undefined8 *)(lVar4 + 0x41);
      uVar7 = *(undefined8 *)(lVar4 + 0x51);
      puVar1 = ((vTxid.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar14 * 2 + 0x10;
      *(undefined8 *)puVar1 = *(undefined8 *)(lVar4 + 0x49);
      *(undefined8 *)(puVar1 + 8) = uVar7;
      puVar1 = ((vTxid.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
               lVar14 * 2;
      *(undefined8 *)puVar1 = uVar5;
      *(undefined8 *)(puVar1 + 8) = uVar6;
    }
    local_438 = 1;
    for (uVar17 = uVar2; 1 < (int)uVar17; uVar17 = uVar17 + 1 >> 1) {
      local_438 = local_438 + 1;
    }
    uVar17 = 1;
    while( true ) {
      if (uVar17 == 0xf) break;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                  super__Vector_impl_data._M_start & 0xffffffffffffff00);
      std::vector<bool,_std::allocator<bool>_>::vector
                (&vMatch,__n_00,(bool *)&tx,(allocator_type *)&pmt3);
      vMatchTxid1.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vMatchTxid1.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vMatchTxid1.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lVar14 = 0;
      for (__n = 0; __n_00 != __n; __n = __n + 1) {
        uVar11 = RandomMixin<FastRandomContext>::randbits
                           (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_rng.
                             super_RandomMixin<FastRandomContext>,uVar17 >> 1);
        rVar20 = std::vector<bool,_std::allocator<bool>_>::operator[](&vMatch,__n);
        puVar12 = rVar20._M_p;
        if (uVar11 == 0) {
          *puVar12 = *puVar12 | rVar20._M_mask;
          std::vector<uint256,_std::allocator<uint256>_>::push_back
                    (&vMatchTxid1,
                     (value_type *)
                     (((vTxid.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                     lVar14));
        }
        else {
          *puVar12 = *puVar12 & ~rVar20._M_mask;
        }
        lVar14 = lVar14 + 0x20;
      }
      CPartialMerkleTree::CPartialMerkleTree(&pmt1,&vTxid,&vMatch);
      local_288._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      lStack_270 = 0;
      local_288._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_288._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree_const,ActionSerialize>
                (&pmt1,&local_288);
      puVar9 = vMatchTxid1.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish;
      puVar8 = vMatchTxid1.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_298 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_290 = "";
      local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg.m_end = in_R9;
      msg.m_begin = in_R8;
      file.m_end = (iterator)0x51;
      file.m_begin = (iterator)&local_298;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_2a8,msg)
      ;
      uVar18 = (int)((ulong)((long)puVar9 - (long)puVar8) >> 5) * local_438 + 1;
      if (uVar2 <= uVar18) {
        uVar18 = uVar2;
      }
      pmt3.super_CPartialMerkleTree.nTransactions._0_1_ =
           (ulong)((long)local_288._M_impl.super__Vector_impl_data._M_finish -
                  (long)(local_288._M_impl.super__Vector_impl_data._M_start + lStack_270)) <=
           (ulong)((uVar18 * 0x102 + 7 >> 3) + 10);
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._12_4_ = 0;
      merkleRoot2.super_base_blob<256U>.m_data._M_elems._0_8_ = anon_var_dwarf_c2ed52;
      merkleRoot2.super_base_blob<256U>.m_data._M_elems._8_8_ =
           (long)"ss.size() <= 10 + (258*n+7)/8" + 0x1d;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)((ulong)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                                   super__Vector_impl_data._M_finish & 0xffffffffffffff00);
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&PTR__lazy_ostream_0113a070;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)boost::unit_test::lazy_ostream::inst;
      tx.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)&merkleRoot2;
      local_2b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_2b0 = "";
      pvVar15 = &DAT_00000001;
      pvVar16 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&pmt3,(lazy_ostream *)&tx,1,0,WARN,_cVar21,(size_t)&local_2b8,
                 0x51);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 ((long)&pmt3.super_CPartialMerkleTree.vBits.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                         ._M_start + 8));
      CPartialMerkleTree::CPartialMerkleTree((CPartialMerkleTree *)&tx);
      CPartialMerkleTree::SerializationOps<DataStream,CPartialMerkleTree,ActionUnserialize>
                ((CPartialMerkleTreeTester *)&tx,&local_288);
      vMatchTxid2.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vMatchTxid2.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vMatchTxid2.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      CPartialMerkleTree::ExtractMatches
                (&merkleRoot2,(CPartialMerkleTree *)&tx,&vMatchTxid2,&vIndex);
      local_308 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_300 = "";
      local_318 = &boost::unit_test::basic_cstring<char_const>::null;
      local_310 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_00.m_end = pvVar16;
      msg_00.m_begin = pvVar15;
      file_00.m_end = (iterator)0x5d;
      file_00.m_begin = (iterator)&local_308;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_318,
                 msg_00);
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0] =
           ::operator==(&merkleRoot1.super_base_blob<256U>,&merkleRoot2.super_base_blob<256U>);
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_400._0_8_ = "merkleRoot1 == merkleRoot2";
      local_400._8_8_ = "";
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((ulong)pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
           0xffffffffffffff00);
      pmt3.super_CPartialMerkleTree._0_8_ = &PTR__lazy_ostream_0113a070;
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
           boost::unit_test::lazy_ostream::inst;
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)local_400;
      local_328 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_320 = "";
      pvVar15 = &DAT_00000001;
      pvVar16 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&merkleRoot3,(lazy_ostream *)&pmt3,1,0,WARN,_cVar21,
                 (size_t)&local_328,0x5d);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(merkleRoot3.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_338 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_330 = "";
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      local_340 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_01.m_end = pvVar16;
      msg_01.m_begin = pvVar15;
      file_01.m_end = (iterator)0x5e;
      file_01.m_begin = (iterator)&local_338;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_348,
                 msg_01);
      bVar10 = base_blob<256U>::IsNull(&merkleRoot2.super_base_blob<256U>);
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0] = !bVar10;
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_400._0_8_ = "!merkleRoot2.IsNull()";
      local_400._8_8_ = "";
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((ulong)pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
           0xffffffffffffff00);
      pmt3.super_CPartialMerkleTree._0_8_ = &PTR__lazy_ostream_0113a070;
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
           boost::unit_test::lazy_ostream::inst;
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)local_400;
      local_358 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_350 = "";
      pvVar15 = &DAT_00000001;
      pvVar16 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&merkleRoot3,(lazy_ostream *)&pmt3,1,0,WARN,_cVar21,
                 (size_t)&local_358,0x5e);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(merkleRoot3.super_base_blob<256U>.m_data._M_elems + 0x10));
      local_368 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_360 = "";
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      local_370 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_02.m_end = pvVar16;
      msg_02.m_begin = pvVar15;
      file_02.m_end = (iterator)0x61;
      file_02.m_begin = (iterator)&local_368;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_378,
                 msg_02);
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0] =
           std::operator==(&vMatchTxid1,&vMatchTxid2);
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[8] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[9] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[10] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
      merkleRoot3.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
      local_400._0_8_ = "vMatchTxid1 == vMatchTxid2";
      local_400._8_8_ = "";
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p =
           (_Bit_type *)
           ((ulong)pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>.
                   _M_impl.super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p &
           0xffffffffffffff00);
      pmt3.super_CPartialMerkleTree._0_8_ = &PTR__lazy_ostream_0113a070;
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._8_8_ =
           boost::unit_test::lazy_ostream::inst;
      pmt3.super_CPartialMerkleTree.vBits.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)local_400;
      local_388 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
      ;
      local_380 = "";
      in_R8 = &DAT_00000001;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&merkleRoot3,(lazy_ostream *)&pmt3,1,0,WARN,_cVar21,
                 (size_t)&local_388,0x61);
      boost::detail::shared_count::~shared_count
                ((shared_count *)(merkleRoot3.super_base_blob<256U>.m_data._M_elems + 0x10));
      iVar19 = 4;
      while( true ) {
        bVar10 = iVar19 == 0;
        iVar19 = iVar19 + -1;
        if (bVar10) break;
        CPartialMerkleTreeTester::CPartialMerkleTreeTester(&pmt3,(CPartialMerkleTreeTester *)&tx);
        CPartialMerkleTreeTester::Damage(&pmt3);
        vMatchTxid3.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        vMatchTxid3.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        vMatchTxid3.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        CPartialMerkleTree::ExtractMatches
                  (&merkleRoot3,&pmt3.super_CPartialMerkleTree,&vMatchTxid3,&vIndex);
        local_3b8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
        ;
        local_3b0 = "";
        local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
        msg_03.m_end = in_R9;
        msg_03.m_begin = in_R8;
        file_03.m_end = (iterator)0x69;
        file_03.m_begin = (iterator)&local_3b8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_3c8
                   ,msg_03);
        local_3e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             ::operator!=(&merkleRoot3.super_base_blob<256U>,&merkleRoot1.super_base_blob<256U>);
        local_3e0.m_message.px = (element_type *)0x0;
        local_3e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_410 = "merkleRoot3 != merkleRoot1";
        local_408 = "";
        local_400._8_8_ = local_400._8_8_ & 0xffffffffffffff00;
        local_400._0_8_ = &PTR__lazy_ostream_0113a070;
        local_3f0 = boost::unit_test::lazy_ostream::inst;
        local_3e8 = &local_410;
        local_420 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pmt_tests.cpp"
        ;
        local_418 = "";
        in_R8 = &DAT_00000001;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_3e0,(lazy_ostream *)local_400,1,0,WARN,_cVar21,(size_t)&local_420,0x69);
        boost::detail::shared_count::~shared_count(&local_3e0.m_message.pn);
        std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                  (&vMatchTxid3.super__Vector_base<uint256,_std::allocator<uint256>_>);
        CPartialMerkleTree::~CPartialMerkleTree(&pmt3.super_CPartialMerkleTree);
      }
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&vIndex.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                (&vMatchTxid2.super__Vector_base<uint256,_std::allocator<uint256>_>);
      CPartialMerkleTree::~CPartialMerkleTree((CPartialMerkleTree *)&tx);
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base(&local_288)
      ;
      CPartialMerkleTree::~CPartialMerkleTree(&pmt1);
      std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
                (&vMatchTxid1.super__Vector_base<uint256,_std::allocator<uint256>_>);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&vMatch.super__Bvector_base<std::allocator<bool>_>);
      uVar17 = uVar17 + 1;
    }
    std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base
              (&vTxid.super__Vector_base<uint256,_std::allocator<uint256>_>);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector(&block.vtx);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(pmt_test1)
{
    static const unsigned int tx_counts[] = {1, 4, 7, 17, 56, 100, 127, 256, 312, 513, 1000, 4095};

    for (int i = 0; i < 12; i++) {
        unsigned int nTx = tx_counts[i];

        // build a block with some dummy transactions
        CBlock block;
        for (unsigned int j=0; j<nTx; j++) {
            CMutableTransaction tx;
            tx.nLockTime = j; // actual transaction data doesn't matter; just make the nLockTime's unique
            block.vtx.push_back(MakeTransactionRef(std::move(tx)));
        }

        // calculate actual merkle root and height
        uint256 merkleRoot1 = BlockMerkleRoot(block);
        std::vector<uint256> vTxid(nTx, uint256());
        for (unsigned int j=0; j<nTx; j++)
            vTxid[j] = block.vtx[j]->GetHash();
        int nHeight = 1, nTx_ = nTx;
        while (nTx_ > 1) {
            nTx_ = (nTx_+1)/2;
            nHeight++;
        }

        // check with random subsets with inclusion chances 1, 1/2, 1/4, ..., 1/128
        for (int att = 1; att < 15; att++) {
            // build random subset of txid's
            std::vector<bool> vMatch(nTx, false);
            std::vector<uint256> vMatchTxid1;
            for (unsigned int j=0; j<nTx; j++) {
                bool fInclude = m_rng.randbits(att / 2) == 0;
                vMatch[j] = fInclude;
                if (fInclude)
                    vMatchTxid1.push_back(vTxid[j]);
            }

            // build the partial merkle tree
            CPartialMerkleTree pmt1(vTxid, vMatch);

            // serialize
            DataStream ss{};
            ss << pmt1;

            // verify CPartialMerkleTree's size guarantees
            unsigned int n = std::min<unsigned int>(nTx, 1 + vMatchTxid1.size()*nHeight);
            BOOST_CHECK(ss.size() <= 10 + (258*n+7)/8);

            // deserialize into a tester copy
            CPartialMerkleTreeTester pmt2{m_rng};
            ss >> pmt2;

            // extract merkle root and matched txids from copy
            std::vector<uint256> vMatchTxid2;
            std::vector<unsigned int> vIndex;
            uint256 merkleRoot2 = pmt2.ExtractMatches(vMatchTxid2, vIndex);

            // check that it has the same merkle root as the original, and a valid one
            BOOST_CHECK(merkleRoot1 == merkleRoot2);
            BOOST_CHECK(!merkleRoot2.IsNull());

            // check that it contains the matched transactions (in the same order!)
            BOOST_CHECK(vMatchTxid1 == vMatchTxid2);

            // check that random bit flips break the authentication
            for (int j=0; j<4; j++) {
                CPartialMerkleTreeTester pmt3(pmt2);
                pmt3.Damage();
                std::vector<uint256> vMatchTxid3;
                uint256 merkleRoot3 = pmt3.ExtractMatches(vMatchTxid3, vIndex);
                BOOST_CHECK(merkleRoot3 != merkleRoot1);
            }
        }
    }
}